

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O0

string * __thiscall
cmGhsMultiTargetGenerator::WriteObjectLangOverride_abi_cxx11_
          (string *__return_storage_ptr__,cmGhsMultiTargetGenerator *this,cmSourceFile *sourceFile)

{
  bool bVar1;
  string *str;
  cmAlphaNum local_e0;
  cmAlphaNum local_b0;
  string local_80;
  allocator<char> local_49;
  string local_48;
  cmValue local_28;
  cmValue rawLangProp;
  cmSourceFile *sourceFile_local;
  string *ret;
  
  rawLangProp.Value._7_1_ = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"LANGUAGE",&local_49);
  local_28 = cmSourceFile::GetProperty((cmSourceFile *)this,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  bVar1 = cmValue::operator_cast_to_bool(&local_28);
  if (bVar1) {
    cmAlphaNum::cmAlphaNum(&local_b0," [");
    str = cmValue::operator*[abi_cxx11_(&local_28);
    cmAlphaNum::cmAlphaNum(&local_e0,str);
    cmStrCat<char[2]>(&local_80,&local_b0,&local_e0,(char (*) [2])0xc88e02);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGhsMultiTargetGenerator::WriteObjectLangOverride(
  const cmSourceFile* sourceFile)
{
  std::string ret;
  cmValue rawLangProp = sourceFile->GetProperty("LANGUAGE");
  if (rawLangProp) {
    ret = cmStrCat(" [", *rawLangProp, "]");
  }

  return ret;
}